

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint128.hpp
# Opt level: O0

ostream * pstore::operator<<(ostream *os,uint128 *value)

{
  ostream *poVar1;
  uint64_t uVar2;
  uint128 *value_local;
  ostream *os_local;
  
  poVar1 = std::operator<<(os,'{');
  uVar2 = uint128::high(value);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,uVar2);
  poVar1 = std::operator<<(poVar1,',');
  uVar2 = uint128::low(value);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,uVar2);
  poVar1 = std::operator<<(poVar1,'}');
  return poVar1;
}

Assistant:

inline std::ostream & operator<< (std::ostream & os, uint128 const & value) {
        return os << '{' << value.high () << ',' << value.low () << '}';
    }